

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O2

history_t * HISTORY_create(void)

{
  history_t *h;
  
  h = (history_t *)malloc(0x2008);
  HISTORY_reset(h);
  return h;
}

Assistant:

history_t *HISTORY_create()
{
    history_t *h = (history_t*)malloc(sizeof(history_t));
    HISTORY_reset(h);
    return h;
}